

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O1

void PARMCI_Memget(size_t bytes,armci_meminfo_t *meminfo,int memflg)

{
  undefined8 in_RAX;
  char *pcVar1;
  int rank;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  comex_group_rank(0,&local_24);
  if (bytes == 0) {
    comex_error("PARMCI_Memget: size must be > 0",0);
  }
  if (meminfo == (armci_meminfo_t *)0x0) {
    comex_error("PARMCI_Memget: Invalid arg #2 (NULL ptr)",0);
  }
  if (memflg != 0) {
    comex_error("PARMCI_Memget: Invalid memflg",memflg);
  }
  pcVar1 = (char *)comex_malloc_local(bytes);
  if (pcVar1 == (char *)0x0 && bytes != 0) {
    comex_error("PARMCI_Memget failed",(int)bytes);
  }
  meminfo->armci_addr = pcVar1;
  meminfo->addr = pcVar1;
  meminfo->size = bytes;
  meminfo->cpid = local_24;
  return;
}

Assistant:

void PARMCI_Memget(size_t bytes, armci_meminfo_t *meminfo, int memflg)
{
    void *myptr=NULL;
    void *armci_ptr=NULL; /* legal ARCMI ptr used in ARMCI data xfer ops*/
    size_t size = bytes;
    int rank;

    comex_group_rank(COMEX_GROUP_WORLD, &rank);

    if(size<=0) comex_error("PARMCI_Memget: size must be > 0", (int)size);
    if(meminfo==NULL) comex_error("PARMCI_Memget: Invalid arg #2 (NULL ptr)",0);
    if(memflg!=0) comex_error("PARMCI_Memget: Invalid memflg", memflg);

    armci_ptr = myptr = comex_malloc_local(size);
    if(size) if(!myptr) comex_error("PARMCI_Memget failed", (int)size);

    /* fill the meminfo structure */
    meminfo->armci_addr = armci_ptr;
    meminfo->addr       = myptr;
    meminfo->size       = size;
    meminfo->cpid       = rank;
    /* meminfo->attr       = NULL; */
}